

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_first_by_single_char_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_first_by_single_char_Test<char16_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionResult iutest_ar;
  array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  AssertionResult local_260;
  AssertionHelper local_238;
  undefined1 local_208 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  unsigned_long local_1e0;
  uint local_1d4;
  array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> local_1d0;
  undefined1 local_1b0 [32];
  bool local_190;
  ios_base local_130 [264];
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_28;
  
  local_28._M_len = 0x1a;
  local_28._M_str = L"dxle::sound_c LoadSoundMem";
  local_1b0._0_2_ = 0x20;
  ::detail::
  operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char16_t,_nullptr>
            (&local_1d0,&local_28,
             (split_helper_subroutine<detail::split_at_first,_char16_t,_char16_t> *)local_1b0);
  local_1d4 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::ExpressionLHS
            ((ExpressionLHS<unsigned_int> *)local_208,&local_1d4);
  local_1e0 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::operator==
            ((ExpressionResult *)&local_238,(ExpressionLHS<unsigned_int> *)local_208,&local_1e0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b0,(ExpressionResult *)&local_238,true);
  paVar1 = &local_260.m_message.field_2;
  local_260.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_1b0._0_8_,(pointer)(local_1b0._0_8_ + local_1b0._8_8_));
  local_260.m_result = local_190;
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  paVar2 = &local_238.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_238.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._8_8_ != &local_1f0) {
    operator_delete((void *)local_208._8_8_,local_1f0._M_allocated_capacity + 1);
  }
  if (local_260.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_208,(internal *)&local_260,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((2u == re.size()))",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,(char *)local_208._0_8_,(allocator<char> *)&local_1e0);
    local_238.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_238.m_part_result.super_iuCodeMessage.m_line = 0x71;
    local_238.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_238,(Fixed *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_238.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) goto LAB_00206128;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = L"dxle::sound_c";
    iutest::internal::
    CmpHelperEQ<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
              (&local_260,(internal *)"constant::cpp_dxle_sound_c<char_type>()","re[0]",local_1b0,
               (char16_t **)&local_1d0,in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_208);
      local_238.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
      ;
      local_238.m_part_result.super_iuCodeMessage.m_line = 0x72;
      local_238.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_238,(Fixed *)local_1b0);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_260.m_message._M_dataplus._M_p,
                        local_260.m_message.field_2._M_allocated_capacity + 1);
      }
      local_1b0._0_8_ = L"LoadSoundMem";
      iutest::internal::
      CmpHelperEQ<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
                (&local_260,(internal *)"constant::cpp_LoadSoundMem<char_type>()","re[1]",local_1b0,
                 (char16_t **)(local_1d0._M_elems + 1),in_R9);
      if (local_260.m_result != false) goto LAB_00206151;
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_208);
      local_238.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
      ;
      local_238.m_part_result.super_iuCodeMessage.m_line = 0x73;
      local_238.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_238,(Fixed *)local_1b0);
    }
    local_208._16_8_ =
         local_238.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    local_208._0_8_ = local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
LAB_00206128:
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
LAB_00206151:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_260.m_message._M_dataplus._M_p,
                    local_260.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_first_by_single_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_type_data2<char_type>();
	const auto re = s | split(constant::space<char_type>()) >> at_first();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::cpp_dxle_sound_c<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::cpp_LoadSoundMem<char_type>(), re[1]);
}